

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_utils.h
# Opt level: O0

void set_primary_rc_buffer_sizes(AV1EncoderConfig *oxcf,AV1_PRIMARY *ppi)

{
  long lVar1;
  long lVar2;
  int64_t local_60;
  int64_t local_58;
  long local_50;
  long local_48;
  int64_t maximum;
  int64_t optimal;
  int64_t starting;
  int64_t bandwidth;
  RateControlCfg *rc_cfg;
  PRIMARY_RATE_CONTROL *p_rc;
  AV1_PRIMARY *ppi_local;
  AV1EncoderConfig *oxcf_local;
  
  local_50 = (oxcf->rc_cfg).target_bandwidth;
  lVar1 = (oxcf->rc_cfg).optimal_buffer_level_ms;
  lVar2 = (oxcf->rc_cfg).maximum_buffer_size_ms;
  (ppi->p_rc).starting_buffer_level = ((oxcf->rc_cfg).starting_buffer_level_ms * local_50) / 1000;
  if (lVar1 == 0) {
    local_48 = local_50 / 8;
  }
  else {
    local_48 = (lVar1 * local_50) / 1000;
  }
  (ppi->p_rc).optimal_buffer_level = local_48;
  if (lVar2 == 0) {
    local_50 = local_50 / 8;
  }
  else {
    local_50 = (lVar2 * local_50) / 1000;
  }
  (ppi->p_rc).maximum_buffer_size = local_50;
  if ((ppi->p_rc).bits_off_target < (ppi->p_rc).maximum_buffer_size) {
    local_58 = (ppi->p_rc).bits_off_target;
  }
  else {
    local_58 = (ppi->p_rc).maximum_buffer_size;
  }
  (ppi->p_rc).bits_off_target = local_58;
  if ((ppi->p_rc).buffer_level < (ppi->p_rc).maximum_buffer_size) {
    local_60 = (ppi->p_rc).buffer_level;
  }
  else {
    local_60 = (ppi->p_rc).maximum_buffer_size;
  }
  (ppi->p_rc).buffer_level = local_60;
  return;
}

Assistant:

static inline void set_primary_rc_buffer_sizes(const AV1EncoderConfig *oxcf,
                                               AV1_PRIMARY *ppi) {
  PRIMARY_RATE_CONTROL *p_rc = &ppi->p_rc;
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;

  const int64_t bandwidth = rc_cfg->target_bandwidth;
  const int64_t starting = rc_cfg->starting_buffer_level_ms;
  const int64_t optimal = rc_cfg->optimal_buffer_level_ms;
  const int64_t maximum = rc_cfg->maximum_buffer_size_ms;

  p_rc->starting_buffer_level = starting * bandwidth / 1000;
  p_rc->optimal_buffer_level =
      (optimal == 0) ? bandwidth / 8 : optimal * bandwidth / 1000;
  p_rc->maximum_buffer_size =
      (maximum == 0) ? bandwidth / 8 : maximum * bandwidth / 1000;

  // Under a configuration change, where maximum_buffer_size may change,
  // keep buffer level clipped to the maximum allowed buffer size.
  p_rc->bits_off_target =
      AOMMIN(p_rc->bits_off_target, p_rc->maximum_buffer_size);
  p_rc->buffer_level = AOMMIN(p_rc->buffer_level, p_rc->maximum_buffer_size);
}